

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void optimize_cmf(png_bytep data,png_alloc_size_t data_size)

{
  byte bVar1;
  uint uVar2;
  bool local_29;
  uint local_24;
  uint tmp;
  uint half_z_window_size;
  uint z_cinfo;
  uint z_cmf;
  png_alloc_size_t data_size_local;
  png_bytep data_local;
  
  if (data_size < 0x4001) {
    uVar2 = (uint)*data;
    if (((uVar2 & 0xf) == 8) && ((uVar2 & 0xf0) < 0x71)) {
      bVar1 = *data >> 4;
      tmp = (uint)bVar1;
      local_24 = 1 << bVar1 + 7;
      if (data_size <= local_24) {
        do {
          local_24 = local_24 >> 1;
          tmp = tmp - 1;
          local_29 = tmp != 0 && data_size <= local_24;
        } while (local_29);
        uVar2 = uVar2 & 0xf | tmp * 0x10;
        *data = (png_byte)uVar2;
        data[1] = ('\x1f' - (char)((uVar2 * 0x100 + (data[1] & 0xe0)) % 0x1f)) +
                  (char)(data[1] & 0xe0);
      }
    }
  }
  return;
}

Assistant:

static void
optimize_cmf(png_bytep data, png_alloc_size_t data_size)
{
   /* Optimize the CMF field in the zlib stream.  The resultant zlib stream is
    * still compliant to the stream specification.
    */
   if (data_size <= 16384) /* else windowBits must be 15 */
   {
      unsigned int z_cmf = data[0];  /* zlib compression method and flags */

      if ((z_cmf & 0x0f) == 8 && (z_cmf & 0xf0) <= 0x70)
      {
         unsigned int z_cinfo;
         unsigned int half_z_window_size;

         z_cinfo = z_cmf >> 4;
         half_z_window_size = 1U << (z_cinfo + 7);

         if (data_size <= half_z_window_size) /* else no change */
         {
            unsigned int tmp;

            do
            {
               half_z_window_size >>= 1;
               --z_cinfo;
            }
            while (z_cinfo > 0 && data_size <= half_z_window_size);

            z_cmf = (z_cmf & 0x0f) | (z_cinfo << 4);

            data[0] = (png_byte)z_cmf;
            tmp = data[1] & 0xe0;
            tmp += 0x1f - ((z_cmf << 8) + tmp) % 0x1f;
            data[1] = (png_byte)tmp;
         }
      }
   }
}